

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::SSARewriter::PrintReplacementTable(SSARewriter *this)

{
  ostream *poVar1;
  __node_base *p_Var2;
  
  std::operator<<((ostream *)&std::cerr,"\nLoad replacement table\n");
  p_Var2 = &(this->load_replacement_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\t%");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," -> %");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  return;
}

Assistant:

void SSARewriter::PrintReplacementTable() const {
  std::cerr << "\nLoad replacement table\n";
  for (const auto& it : load_replacement_) {
    std::cerr << "\t%" << it.first << " -> %" << it.second << "\n";
  }
  std::cerr << "\n";
}